

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O1

void __thiscall duckdb::UnzipCommand::ExecuteInternal(UnzipCommand *this,ExecuteContext *context)

{
  pointer pcVar1;
  void *pvVar2;
  type pFVar3;
  long lVar4;
  CatalogException *pCVar5;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> output_file;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
  compressed_file_handle;
  VirtualFileSystem vfs;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_130;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_128;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  code *local_c0;
  vector<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
  local_b8 [24];
  _Rb_tree<duckdb::FileCompressionType,_std::pair<const_duckdb::FileCompressionType,_duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>,_std::_Select1st<std::pair<const_duckdb::FileCompressionType,_duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>,_std::less<duckdb::FileCompressionType>,_std::allocator<std::pair<const_duckdb::FileCompressionType,_duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>_>
  local_a0 [48];
  long *local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  duckdb::VirtualFileSystem::VirtualFileSystem((VirtualFileSystem *)&local_c0);
  duckdb::FileSystem::OpenFile
            (&local_128,(VirtualFileSystem *)&local_c0,&this->input_path,1,0x200,0);
  if (local_128._M_head_impl == (FileHandle *)0x0) {
    pCVar5 = (CatalogException *)__cxa_allocate_exception(0x10);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Cannot open the file \"%s\"","");
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    pcVar1 = (this->input_path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,pcVar1,pcVar1 + (this->input_path)._M_string_length);
    CatalogException::CatalogException<std::__cxx11::string>(pCVar5,&local_120,&local_e0);
    __cxa_throw(pCVar5,&CatalogException::typeinfo,std::runtime_error::~runtime_error);
  }
  duckdb::FileSystem::OpenFile(&local_130,&local_c0,&this->extraction_path,10,0x100,0);
  if (local_130._M_head_impl == (FileHandle *)0x0) {
    pCVar5 = (CatalogException *)__cxa_allocate_exception(0x10);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Cannot open the file \"%s\"","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    pcVar1 = (this->extraction_path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,pcVar1,pcVar1 + (this->extraction_path)._M_string_length);
    CatalogException::CatalogException<std::__cxx11::string>(pCVar5,&local_120,&local_100);
    __cxa_throw(pCVar5,&CatalogException::typeinfo,std::runtime_error::~runtime_error);
  }
  do {
    pvVar2 = operator_new__(0x100000);
    pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                        *)&local_128);
    lVar4 = duckdb::VirtualFileSystem::Read((FileHandle *)&local_c0,pFVar3,(long)pvVar2);
    if (lVar4 == 0) {
      operator_delete__(pvVar2);
      break;
    }
    pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                        *)&local_130);
    duckdb::VirtualFileSystem::Write((FileHandle *)&local_c0,pFVar3,(long)pvVar2);
    operator_delete__(pvVar2);
  } while (lVar4 != 0);
  if (local_130._M_head_impl != (FileHandle *)0x0) {
    (**(code **)(*(long *)local_130._M_head_impl + 8))();
  }
  if (local_128._M_head_impl != (FileHandle *)0x0) {
    (**(code **)(*(long *)local_128._M_head_impl + 8))();
  }
  local_c0 = duckdb::StreamQueryResult::Materialize;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  if (local_70 != (long *)0x0) {
    (**(code **)(*local_70 + 8))();
  }
  local_70 = (long *)0x0;
  std::
  _Rb_tree<duckdb::FileCompressionType,_std::pair<const_duckdb::FileCompressionType,_duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>,_std::_Select1st<std::pair<const_duckdb::FileCompressionType,_duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>,_std::less<duckdb::FileCompressionType>,_std::allocator<std::pair<const_duckdb::FileCompressionType,_duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>_>
  ::~_Rb_tree(local_a0);
  std::
  vector<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
  ::~vector(local_b8);
  duckdb::FileSystem::~FileSystem((FileSystem *)&local_c0);
  return;
}

Assistant:

void UnzipCommand::ExecuteInternal(ExecuteContext &context) const {
	VirtualFileSystem vfs;

	// input
	FileOpenFlags in_flags(FileFlags::FILE_FLAGS_READ);
	in_flags.SetCompression(FileCompressionType::GZIP);
	auto compressed_file_handle = vfs.OpenFile(input_path, in_flags);
	if (compressed_file_handle == nullptr) {
		throw CatalogException("Cannot open the file \"%s\"", input_path);
	}

	// output
	FileOpenFlags out_flags(FileOpenFlags::FILE_FLAGS_FILE_CREATE | FileOpenFlags::FILE_FLAGS_WRITE);
	auto output_file = vfs.OpenFile(extraction_path, out_flags);
	if (!output_file) {
		throw CatalogException("Cannot open the file \"%s\"", extraction_path);
	}

	// read the compressed data from the file
	while (true) {
		std::unique_ptr<char[]> compressed_buffer(new char[BUFFER_SIZE]);
		int64_t bytes_read = vfs.Read(*compressed_file_handle, compressed_buffer.get(), BUFFER_SIZE);
		if (bytes_read == 0) {
			break;
		}

		vfs.Write(*output_file, compressed_buffer.get(), bytes_read);
	}
}